

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buttons.cpp
# Opt level: O0

void __thiscall GPIO::Switch::triggered(Switch *this,uint gpio)

{
  bool bVar1;
  uint uVar2;
  undefined1 __args;
  long in_RDI;
  uint in_stack_ffffffffffffffe0;
  
  bVar1 = DigitalIn::triggered((DigitalIn *)0x125e83);
  if (bVar1) {
    uVar2 = DigitalIn::get_state((DigitalIn *)(in_RDI + 0xa8));
    if (uVar2 == 0) {
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_()> *)(ulong)in_stack_ffffffffffffffe0);
      if (bVar1) {
        std::function<void_()>::operator()
                  ((function<void_()> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
      }
    }
    else if ((uVar2 == 1) &&
            (bVar1 = std::function::operator_cast_to_bool
                               ((function<void_()> *)CONCAT44(1,in_stack_ffffffffffffffe0)), bVar1))
    {
      std::function<void_()>::operator()
                ((function<void_()> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    }
    bVar1 = std::function::operator_cast_to_bool((function<void_(bool)> *)0x125f10);
    if (bVar1) {
      __args = (undefined1)((ulong)(in_RDI + 0x48) >> 0x38);
      DigitalIn::get_state((DigitalIn *)(in_RDI + 0xa8));
      std::function<void_(bool)>::operator()
                ((function<void_(bool)> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),(bool)__args);
    }
  }
  return;
}

Assistant:

void Switch::triggered(unsigned int gpio)
{
    // check if this is really a new event, or still a bouncing switch

    if (!m_pin.triggered()) return;
    
    // now call the virtual functions to trigger some action

    switch (m_pin.get_state()) {
        case false:
            if (f_off) f_off();
            break;

        case true:
            if (f_on) f_on();
            break;
    }
    
    if (f_switched) f_switched(m_pin.get_state());
}